

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_widgets.cpp
# Opt level: O0

char * ImAtoi<double>(char *src,double *output)

{
  bool bVar1;
  double local_30;
  double v;
  int negative;
  double *output_local;
  char *src_local;
  
  src_local = src;
  if (*src == '-') {
    src_local = src + 1;
  }
  if (*src_local == '+') {
    src_local = src_local + 1;
  }
  v = 0.0;
  while( true ) {
    bVar1 = false;
    if ('/' < *src_local) {
      bVar1 = *src_local < ':';
    }
    if (!bVar1) break;
    v = v * 10.0 + (double)(*src_local + -0x30);
    src_local = src_local + 1;
  }
  if (*src == '-') {
    local_30 = -v;
  }
  else {
    local_30 = v;
  }
  *output = local_30;
  return src_local;
}

Assistant:

static const char* ImAtoi(const char* src, TYPE* output)
{
    int negative = 0;
    if (*src == '-') { negative = 1; src++; }
    if (*src == '+') { src++; }
    TYPE v = 0;
    while (*src >= '0' && *src <= '9')
        v = (v * 10) + (*src++ - '0');
    *output = negative ? -v : v;
    return src;
}